

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void duckdb::MergeUpdateLoop<unsigned_short>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  UpdateInfo *__dest;
  void *__dest_00;
  uint uVar1;
  uint uVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  row_t rVar8;
  void *__dest_01;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  data_ptr_t pdVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  unsigned_short result_values [2048];
  sel_t result_ids [2048];
  undefined2 local_3038 [2048];
  uint local_2038 [2050];
  
  pSVar3 = update->sel;
  pdVar4 = update->data;
  lVar16 = base_info->vector_index * 0x800 + base_info->segment->column_data->start;
  __dest = base_info + 1;
  uVar1 = base_info->max;
  __dest_00 = (void *)((long)&base_info[1].segment + (ulong)uVar1 * 4);
  __dest_01 = (void *)((long)&update_info[1].segment + (ulong)update_info->max * 4);
  lVar11 = (ulong)update_info->max * 4;
  if (count == 0) {
    lVar14 = 0;
    uVar20 = 0;
  }
  else {
    pdVar5 = base_data->data;
    psVar6 = sel->sel_vector;
    uVar15 = (ulong)update_info->N;
    uVar17 = (ulong)base_info->N;
    uVar20 = 0;
    uVar9 = 0;
    lVar14 = 0;
    uVar10 = 0;
    do {
      uVar12 = uVar9;
      if (psVar6 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar6[uVar9];
      }
      uVar21 = ids[uVar12] - lVar16;
      bVar22 = uVar20 < uVar15;
      uVar12 = uVar10;
      if (bVar22) {
        uVar18 = (ulong)*(uint *)((long)&update_info[1].segment + uVar20 * 4);
        if (uVar18 < uVar21) {
          lVar19 = 0;
          do {
            local_3038[lVar14 + lVar19] =
                 *(undefined2 *)((long)&update_info[1].segment + lVar19 * 2 + uVar20 * 2 + lVar11);
            local_2038[lVar14 + lVar19] = (uint)uVar18;
            if ((1 - uVar15) + uVar20 + lVar19 == 0) {
              lVar14 = lVar14 + lVar19 + 1;
              uVar20 = uVar20 + 1 + lVar19;
              goto LAB_01116f50;
            }
            uVar18 = (ulong)*(uint *)((long)&update_info[1].segment + lVar19 * 4 + uVar20 * 4 + 4);
            lVar19 = lVar19 + 1;
          } while (uVar18 < uVar21);
          uVar20 = uVar20 + lVar19;
          bVar22 = uVar20 < uVar15;
          lVar14 = lVar14 + lVar19;
        }
        if ((!bVar22) || (uVar21 != uVar18)) goto LAB_01116f50;
        local_3038[lVar14] = *(undefined2 *)((long)__dest_01 + uVar20 * 2);
        local_2038[lVar14] = (uint)uVar18;
        uVar20 = uVar20 + 1;
      }
      else {
LAB_01116f50:
        bVar22 = uVar10 < uVar17;
        if (bVar22) {
          uVar18 = (ulong)*(uint *)((long)&__dest->segment + uVar10 * 4);
          if (uVar18 < uVar21) {
            do {
              uVar12 = uVar17;
              if (uVar17 - 1 == uVar10) goto LAB_01116f95;
              uVar18 = (ulong)*(uint *)((long)&base_info[1].segment + uVar10 * 4 + 4);
              uVar10 = uVar10 + 1;
            } while (uVar18 < uVar21);
            bVar22 = uVar10 < uVar17;
          }
          uVar12 = uVar10;
          if ((!bVar22) || (uVar21 != uVar18)) goto LAB_01116f95;
          pdVar13 = (data_ptr_t)((long)__dest_00 + uVar10 * 2);
        }
        else {
LAB_01116f95:
          pdVar13 = pdVar5 + uVar21 * 2;
        }
        local_3038[lVar14] = *(undefined2 *)pdVar13;
        local_2038[lVar14] = (uint)uVar21;
      }
      lVar14 = lVar14 + 1;
      uVar9 = uVar9 + 1;
      uVar10 = uVar12;
    } while (uVar9 != count);
  }
  uVar10 = (ulong)update_info->N;
  lVar19 = uVar10 - uVar20;
  if (uVar20 <= uVar10 && lVar19 != 0) {
    switchD_015ff80e::default
              (local_3038 + lVar14,(void *)((long)&update_info[1].segment + uVar20 * 2 + lVar11),
               lVar19 * 2);
    switchD_015ff80e::default
              (local_2038 + lVar14,(void *)((long)&update_info[1].segment + uVar20 * 4),lVar19 * 4);
    lVar14 = (lVar14 - uVar20) + uVar10;
  }
  update_info->N = (sel_t)lVar14;
  switchD_015ff80e::default(__dest_01,local_3038,lVar14 * 2);
  switchD_015ff80e::default(update_info + 1,local_2038,lVar14 << 2);
  uVar20 = (ulong)base_info->N;
  if (count == 0 || uVar20 == 0) {
    lVar11 = 0;
    uVar9 = 0;
    uVar10 = 0;
  }
  else {
    psVar6 = sel->sel_vector;
    psVar7 = pSVar3->sel_vector;
    lVar11 = 0;
    uVar10 = 0;
    uVar9 = 0;
    do {
      uVar15 = uVar10;
      if (psVar6 != (sel_t *)0x0) {
        uVar15 = (ulong)psVar6[uVar10];
      }
      uVar17 = ids[uVar15] - lVar16;
      uVar2 = *(uint *)((long)&__dest->segment + uVar9 * 4);
      if (uVar17 == uVar2) {
        if (psVar7 != (sel_t *)0x0) {
          uVar15 = (ulong)psVar7[uVar15];
        }
        local_3038[lVar11] = *(undefined2 *)(pdVar4 + uVar15 * 2);
        local_2038[lVar11] = (uint)uVar17;
        uVar10 = uVar10 + 1;
LAB_01117123:
        uVar9 = uVar9 + 1;
      }
      else {
        if (uVar2 <= uVar17) {
          local_3038[lVar11] = *(undefined2 *)((long)__dest_00 + uVar9 * 2);
          local_2038[lVar11] = uVar2;
          goto LAB_01117123;
        }
        if (psVar7 != (sel_t *)0x0) {
          uVar15 = (ulong)psVar7[uVar15];
        }
        local_3038[lVar11] = *(undefined2 *)(pdVar4 + uVar15 * 2);
        local_2038[lVar11] = (uint)uVar17;
        uVar10 = uVar10 + 1;
      }
      lVar11 = lVar11 + 1;
    } while ((uVar10 < count) && (uVar9 < uVar20));
  }
  if (uVar10 < count) {
    psVar6 = sel->sel_vector;
    psVar7 = pSVar3->sel_vector;
    do {
      uVar15 = uVar10;
      if (psVar6 != (sel_t *)0x0) {
        uVar15 = (ulong)psVar6[uVar10];
      }
      uVar17 = uVar15;
      if (psVar7 != (sel_t *)0x0) {
        uVar17 = (ulong)psVar7[uVar15];
      }
      rVar8 = ids[uVar15];
      local_3038[lVar11] = *(undefined2 *)(pdVar4 + uVar17 * 2);
      local_2038[lVar11] = (int)rVar8 - (int)lVar16;
      lVar11 = lVar11 + 1;
      uVar10 = uVar10 + 1;
    } while (count != uVar10);
  }
  lVar16 = uVar20 - uVar9;
  if (uVar9 <= uVar20 && lVar16 != 0) {
    switchD_015ff80e::default
              (local_3038 + lVar11,
               (void *)((long)&base_info[1].segment + uVar9 * 2 + (ulong)uVar1 * 4),lVar16 * 2);
    switchD_015ff80e::default
              (local_2038 + lVar11,(void *)((long)&base_info[1].segment + uVar9 * 4),lVar16 * 4);
    lVar11 = lVar11 + lVar16;
  }
  base_info->N = (sel_t)lVar11;
  switchD_015ff80e::default(__dest_00,local_3038,lVar11 * 2);
  switchD_015ff80e::default(__dest,local_2038,lVar11 << 2);
  return;
}

Assistant:

static void MergeUpdateLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                            UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto base_table_data = FlatVector::GetData<T>(base_data);
	auto update_vector_data = update.GetData<T>(update);
	MergeUpdateLoopInternal<T, T>(base_info, base_table_data, update_info, *update.sel, update_vector_data, ids, count,
	                              sel);
}